

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

int __thiscall
fmt::v8::
basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
::get_id<char32_t>(basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
                   *this,basic_string_view<char32_t> name)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  
  uVar4 = name.size_;
  if ((this->desc_ >> 0x3e & 1) != 0) {
    uVar6 = (ulong)(-1 < (long)this->desc_) << 4 | 0xffffffffffffffe0;
    lVar1 = *(long *)((long)&((this->field_1).values_)->field_0 + uVar6 + 8);
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)&((this->field_1).values_)->field_0 + uVar6);
      lVar7 = 0;
      do {
        lVar3 = *(long *)(lVar2 + lVar7 * 0x10);
        uVar6 = 0xffffffffffffffff;
        uVar8 = 0;
        do {
          uVar5 = uVar8;
          lVar9 = uVar6 * 4;
          uVar6 = uVar6 + 1;
          uVar8 = uVar5 + 1;
        } while (*(int *)(lVar3 + 4 + lVar9) != 0);
        uVar8 = uVar4;
        if (uVar6 < uVar4) {
          uVar8 = uVar6;
        }
        if (uVar8 == 0) {
          bVar10 = true;
        }
        else {
          if (uVar4 < uVar5) {
            uVar5 = uVar4;
          }
          lVar9 = 0;
          do {
            bVar10 = name.data_[lVar9] == *(char32_t *)(lVar3 + lVar9 * 4);
            if (!bVar10) break;
            bVar11 = uVar5 - 1 != lVar9;
            lVar9 = lVar9 + 1;
          } while (bVar11);
        }
        if ((uVar4 == uVar6) && (bVar10)) {
          return *(int *)(lVar2 + 8 + lVar7 * 0x10);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != lVar1);
    }
  }
  return -1;
}

Assistant:

auto has_named_args() const -> bool {
    return (desc_ & detail::has_named_args_bit) != 0;
  }